

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CropResizeLayerParams::SharedCtor(CropResizeLayerParams *this)

{
  *(undefined8 *)((long)&this->boxindicesmode_ + 4) = 0;
  this->spatialscale_ = 0.0;
  this->_cached_size_ = 0;
  this->mode_ = (SamplingMode *)0x0;
  this->boxindicesmode_ = (BoxCoordinatesMode *)0x0;
  return;
}

Assistant:

void CropResizeLayerParams::SharedCtor() {
  ::memset(&mode_, 0, reinterpret_cast<char*>(&spatialscale_) -
    reinterpret_cast<char*>(&mode_) + sizeof(spatialscale_));
  _cached_size_ = 0;
}